

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Desc::reSize(Desc *this,int rowDim,int colDim)

{
  int iVar1;
  int iVar2;
  Status *pSVar3;
  long lVar4;
  
  iVar1 = (this->rowstat).thesize;
  iVar2 = (this->colstat).thesize;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::reSize(&this->rowstat,rowDim);
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::reSize(&this->colstat,colDim);
  pSVar3 = (this->rowstat).data;
  for (lVar4 = (long)rowDim; iVar1 < lVar4; lVar4 = lVar4 + -1) {
    pSVar3[lVar4 + -1] = D_UNDEFINED;
  }
  pSVar3 = (this->colstat).data;
  for (lVar4 = (long)colDim; iVar2 < lVar4; lVar4 = lVar4 + -1) {
    pSVar3[lVar4 + -1] = D_UNDEFINED;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::Desc::reSize(int rowDim, int colDim)
{

   assert(rowDim >= 0);
   assert(colDim >= 0);

   int noldrows = rowstat.size();
   int noldcols = colstat.size();

   rowstat.reSize(rowDim);
   colstat.reSize(colDim);

   for(int i = rowDim - 1; i >= noldrows; i--)
      rowstat[i] = D_UNDEFINED;

   for(int i = colDim - 1; i >= noldcols; i--)
      colstat[i] = D_UNDEFINED;
}